

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC3TL1SL_Test::
~DatarateTestSVC_BasicRateTargetingSVC3TL1SL_Test
          (DatarateTestSVC_BasicRateTargetingSVC3TL1SL_Test *this)

{
  DatarateTestSVC::~DatarateTestSVC(&this->super_DatarateTestSVC);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC3TL1SL) {
  BasicRateTargetingSVC3TL1SLTest();
}